

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

shared_ptr<kratos::AssignStmt> __thiscall
kratos::Var::assign_(Var *this,shared_ptr<kratos::Var> *var,AssignmentType type)

{
  int iVar1;
  VarException *pVVar2;
  UserException *this_00;
  undefined4 in_register_00000014;
  AssignmentType *__args_2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  shared_ptr<kratos::AssignStmt> sVar4;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  IRNode *local_f8;
  undefined8 uStack_f0;
  IRNode *local_d8;
  undefined8 local_d0;
  string local_c8;
  undefined1 local_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  __node_base _Stack_88;
  size_type local_80;
  _Prime_rehash_policy _Stack_78;
  IRNode *pIStack_68;
  undefined8 local_60;
  string local_58;
  allocator_type local_29;
  AssignmentType type_local;
  
  __args_2 = (AssignmentType *)CONCAT44(in_register_00000014,type);
  if (*(undefined8 *)__args_2 == Blocking) {
    this_00 = (UserException *)__cxa_allocate_exception(0x10);
    (*(code *)(((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->sinks_).
              _M_h._M_buckets)(&local_58,var);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   "Trying to assign null to ",&local_58);
    UserException::UserException(this_00,(string *)local_a8);
    __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = *(int *)&var[0x16].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
  if (iVar1 == 1) {
    local_98._M_allocated_capacity = (size_type)&pIStack_68;
    _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_98._8_8_ = 1;
    _Stack_88._M_nxt = (_Hash_node_base *)0x0;
    local_80 = 0;
    _Stack_78._M_max_load_factor = 1.0;
    _Stack_78._4_4_ = 0;
    _Stack_78._M_next_resize = 0;
    pIStack_68 = (IRNode *)0x0;
    local_a8 = (undefined1  [8])&PTR_visit_root_002a63a8;
    local_60 = 1;
    IRVisitor::visit_root((IRVisitor *)local_a8,(IRNode *)var);
    if ((char)local_60 == '\0') {
      pVVar2 = (VarException *)__cxa_allocate_exception(0x10);
      (**(code **)(**(long **)__args_2 + 0xf8))(&local_f8);
      local_58.field_2._M_allocated_capacity =
           (size_type)
           var[7].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_58.field_2._8_8_ =
           var[8].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_58._M_dataplus._M_p = (pointer)local_f8;
      local_58._M_string_length = uStack_f0;
      bVar3 = fmt::v7::to_string_view<char,_0>("Cannot assign {0} to an expression");
      format_str_00.data_ = (char *)bVar3.size_;
      format_str_00.size_ = 0xdd;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_58;
      fmt::v7::detail::vformat_abi_cxx11_(&local_c8,(detail *)bVar3.data_,format_str_00,args_00);
      local_d0 = *(undefined8 *)__args_2;
      __l_00._M_len = 2;
      __l_00._M_array = &local_d8;
      local_d8 = (IRNode *)var;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 &local_58,__l_00,&local_29);
      VarException::VarException
                (pVVar2,&local_c8,
                 (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 &local_58);
      __cxa_throw(pVVar2,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    IRVisitor::~IRVisitor((IRVisitor *)local_a8);
  }
  else if (iVar1 == 3) {
    pVVar2 = (VarException *)__cxa_allocate_exception(0x10);
    (**(code **)(**(long **)__args_2 + 0xf8))(&local_c8);
    local_98._M_allocated_capacity =
         (size_type)
         var[7].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_98._8_8_ = var[8].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_a8 = (undefined1  [8])local_c8._M_dataplus._M_p;
    _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length;
    bVar3 = fmt::v7::to_string_view<char,_0>("Cannot assign {0} to a const {1}");
    format_str.data_ = (char *)bVar3.size_;
    format_str.size_ = 0xdd;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_a8;
    fmt::v7::detail::vformat_abi_cxx11_(&local_58,(detail *)bVar3.data_,format_str,args);
    uStack_f0 = *(undefined8 *)__args_2;
    __l._M_len = 2;
    __l._M_array = &local_f8;
    local_f8 = (IRNode *)var;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_a8,
               __l,(allocator_type *)&local_d8);
    VarException::VarException
              (pVVar2,&local_58,
               (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)local_a8);
    __cxa_throw(pVVar2,&VarException::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)local_a8,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &var[6].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  make_shared<kratos::AssignStmt,std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::Var>const&,kratos::AssignmentType&>
            ((shared_ptr<kratos::Var> *)this,(shared_ptr<kratos::Var> *)local_a8,__args_2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_a0);
  sVar4.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::AssignStmt>)
         sVar4.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<AssignStmt> Var::assign_(const std::shared_ptr<Var> &var, AssignmentType type) {
    if (!var) {
        throw UserException("Trying to assign null to " + to_string());
    }
    // if it's a constant or expression, it can't be assigned to
    if (type_ == VarType::ConstValue) {
        throw VarException(::format("Cannot assign {0} to a const {1}", var->to_string(), name),
                           {this, var.get()});
    } else if (type_ == VarType::Expression) {
        auto all_concat = AllConcat();
        all_concat.visit_root(this);
        if (!all_concat.legal)
            throw VarException(
                ::format("Cannot assign {0} to an expression", var->to_string(), name),
                {this, var.get()});
    }

    auto stmt = ::make_shared<AssignStmt>(shared_from_this(), var, type);

    return stmt;
}